

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O2

StepStatus __thiscall
adios2::core::engine::BP5Writer::BeginStep(BP5Writer *this,StepMode mode,float timeoutSeconds)

{
  Comm *this_00;
  int iVar1;
  AttrMap *pAVar2;
  ostream *poVar3;
  ChunkV *this_01;
  MallocV *this_02;
  string *this_03;
  __node_base *p_Var4;
  TimePoint TVar5;
  double dVar6;
  double dVar7;
  allocator local_134;
  allocator local_133;
  allocator local_132;
  allocator local_131;
  duration local_130;
  string local_128;
  duration local_108;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  if ((this->super_Engine).m_BetweenStepPairs == true) {
    std::__cxx11::string::string((string *)&local_128,"Engine",&local_131);
    std::__cxx11::string::string((string *)&local_40,"BP5Writer",&local_132);
    std::__cxx11::string::string((string *)&local_60,"BeginStep",&local_133);
    std::__cxx11::string::string
              ((string *)&local_80,
               "BeginStep() is called a second time without an intervening EndStep()",&local_134);
    helper::Throw<std::logic_error>(&local_128,&local_40,&local_60,&local_80,-1);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_128);
  }
  Now();
  (this->super_Engine).m_BetweenStepPairs = true;
  if (this->m_IsFirstStep == false) {
    TVar5 = Now();
    dVar6 = ((double)TVar5.__d.__r - (this->m_EndStepEnd).__d.__r) / 1000000000.0;
    (this->m_LastTimeBetweenSteps).__r = dVar6;
    dVar7 = (this->m_TotalTimeBetweenSteps).__r + dVar6;
    (this->m_TotalTimeBetweenSteps).__r = dVar7;
    dVar7 = dVar7 / (double)this->m_WriterStep;
    (this->m_AvgTimeBetweenSteps).__r = dVar7;
    (this->m_ExpectedTimeBetweenSteps).__r = dVar6;
    if (dVar7 < dVar6) {
      (this->m_ExpectedTimeBetweenSteps).__r = dVar7;
    }
  }
  if ((this->m_IsFirstStep == true) &&
     ((this->super_BP5Engine).m_Parameters.UseOneTimeAttributes == true)) {
    pAVar2 = IO::GetAttributes_abi_cxx11_((this->super_Engine).m_IO);
    p_Var4 = &(pAVar2->_M_h)._M_before_begin;
    while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
      adios2::format::BP5Serializer::OnetimeMarshalAttribute
                (&this->m_BP5Serializer,(AttributeBase *)p_Var4[5]._M_nxt);
    }
    this->m_MarshalAttributesNecessary = false;
  }
  this->m_IsFirstStep = false;
  if ((this->super_BP5Engine).m_Parameters.AsyncWrite != 0) {
    shm::Spinlock::lock(&this->m_AsyncWriteLock);
    this->m_flagRush = true;
    shm::Spinlock::unlock(&this->m_AsyncWriteLock);
    local_108.__r = (rep_conflict)Now();
    if ((this->m_WriteFuture).super___basic_future<int>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::__cxx11::string::string((string *)&local_a0,"BS_WaitOnAsync",(allocator *)&local_128);
      profiling::JSONProfiler::Start(&this->m_Profiler,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::future<int>::get(&this->m_WriteFuture);
      this_00 = &(this->super_Engine).m_Comm;
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      local_128._M_string_length = 0;
      local_128.field_2._M_local_buf[0] = '\0';
      helper::Comm::Barrier(this_00,&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      AsyncWriteDataCleanup(this);
      local_130.__r = (rep_conflict)Now();
      iVar1 = helper::Comm::Rank(this_00);
      if (iVar1 == 0) {
        WriteMetadataFileIndex(this,this->m_LatestMetaDataPos,this->m_LatestMetaDataSize);
        if (0 < (this->super_BP5Engine).m_Parameters.verbose) {
          local_130.__r = (local_130.__r - local_108.__r) / 1000000000.0;
          std::operator<<((ostream *)&std::cout,"BeginStep, wait on async write was = ");
          poVar3 = std::ostream::_M_insert<double>(local_130.__r);
          std::operator<<(poVar3," time since EndStep was = ");
          poVar3 = std::ostream::_M_insert<double>((this->m_LastTimeBetweenSteps).__r);
          std::operator<<(poVar3," expect next one to be = ");
          poVar3 = std::ostream::_M_insert<double>((this->m_ExpectedTimeBetweenSteps).__r);
          std::endl<char,std::char_traits<char>>(poVar3);
        }
      }
      std::__cxx11::string::string((string *)&local_c0,"BS_WaitOnAsync",(allocator *)&local_128);
      profiling::JSONProfiler::Stop(&this->m_Profiler,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
    }
  }
  if ((this->super_BP5Engine).m_Parameters.BufferVType == 0) {
    this_02 = (MallocV *)operator_new(0xa0);
    std::__cxx11::string::string((string *)&local_e0,"BP5Writer",(allocator *)&local_128);
    adios2::format::MallocV::MallocV
              (this_02,&local_e0,false,(this->m_BP5Serializer).m_BufferAlign,
               (this->m_BP5Serializer).m_BufferBlockSize,
               (this->super_BP5Engine).m_Parameters.InitialBufferSize,
               (double)(this->super_BP5Engine).m_Parameters.GrowthFactor);
    adios2::format::BP5Serializer::InitStep(&this->m_BP5Serializer,(BufferV *)this_02);
    this_03 = &local_e0;
  }
  else {
    this_01 = (ChunkV *)operator_new(0xb0);
    std::__cxx11::string::string((string *)&local_100,"BP5Writer",(allocator *)&local_128);
    adios2::format::ChunkV::ChunkV
              (this_01,&local_100,false,(this->m_BP5Serializer).m_BufferAlign,
               (this->m_BP5Serializer).m_BufferBlockSize,
               (this->super_BP5Engine).m_Parameters.BufferChunkSize);
    adios2::format::BP5Serializer::InitStep(&this->m_BP5Serializer,(BufferV *)this_01);
    this_03 = &local_100;
  }
  std::__cxx11::string::~string((string *)this_03);
  this->m_ThisTimestepDataSize = 0;
  Now();
  return OK;
}

Assistant:

StepStatus BP5Writer::BeginStep(StepMode mode, const float timeoutSeconds)
{
    if (m_BetweenStepPairs)
    {
        helper::Throw<std::logic_error>("Engine", "BP5Writer", "BeginStep",
                                        "BeginStep() is called a second time "
                                        "without an intervening EndStep()");
    }

    Seconds ts = Now() - m_EngineStart;
    // std::cout << "BEGIN STEP starts at: " << ts.count() << std::endl;
    m_BetweenStepPairs = true;

    if (!m_IsFirstStep)
    {
        m_LastTimeBetweenSteps = Now() - m_EndStepEnd;
        m_TotalTimeBetweenSteps += m_LastTimeBetweenSteps;
        m_AvgTimeBetweenSteps = m_TotalTimeBetweenSteps / m_WriterStep;
        m_ExpectedTimeBetweenSteps = m_LastTimeBetweenSteps;
        if (m_ExpectedTimeBetweenSteps > m_AvgTimeBetweenSteps)
        {
            m_ExpectedTimeBetweenSteps = m_AvgTimeBetweenSteps;
        }
    }

    if (m_IsFirstStep && m_Parameters.UseOneTimeAttributes)
    {
        const auto &attributes = m_IO.GetAttributes();

        for (const auto &attributePair : attributes)
        {
            m_BP5Serializer.OnetimeMarshalAttribute(*(attributePair.second));
        }
        m_MarshalAttributesNecessary = false;
    }

    // one-time stuff after Open must be done above
    m_IsFirstStep = false;

    if (m_Parameters.AsyncWrite)
    {
        m_AsyncWriteLock.lock();
        m_flagRush = true;
        m_AsyncWriteLock.unlock();
        TimePoint wait_start = Now();
        if (m_WriteFuture.valid())
        {
            m_Profiler.Start("BS_WaitOnAsync");
            m_WriteFuture.get();
            m_Comm.Barrier();
            AsyncWriteDataCleanup();
            Seconds wait = Now() - wait_start;
            if (m_Comm.Rank() == 0)
            {
                WriteMetadataFileIndex(m_LatestMetaDataPos, m_LatestMetaDataSize);
                if (m_Parameters.verbose > 0)
                {
                    std::cout << "BeginStep, wait on async write was = " << wait.count()
                              << " time since EndStep was = " << m_LastTimeBetweenSteps.count()
                              << " expect next one to be = " << m_ExpectedTimeBetweenSteps.count()
                              << std::endl;
                }
            }
            m_Profiler.Stop("BS_WaitOnAsync");
        }
    }

    if (m_Parameters.BufferVType == (int)BufferVType::MallocVType)
    {
        m_BP5Serializer.InitStep(new MallocV(
            "BP5Writer", false, m_BP5Serializer.m_BufferAlign, m_BP5Serializer.m_BufferBlockSize,
            m_Parameters.InitialBufferSize, m_Parameters.GrowthFactor));
    }
    else
    {
        m_BP5Serializer.InitStep(new ChunkV("BP5Writer", false, m_BP5Serializer.m_BufferAlign,
                                            m_BP5Serializer.m_BufferBlockSize,
                                            m_Parameters.BufferChunkSize));
    }
    m_ThisTimestepDataSize = 0;

    ts = Now() - m_EngineStart;
    // std::cout << "BEGIN STEP ended at: " << ts.count() << std::endl;
    return StepStatus::OK;
}